

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

void __thiscall SubprocessSet::~SubprocessSet(SubprocessSet *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  SubprocessSet *this_local;
  
  Clear(this);
  iVar1 = sigaction(2,(sigaction *)&this->old_int_act_,(sigaction *)0x0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigaction: %s",pcVar3);
  }
  iVar1 = sigaction(0xf,(sigaction *)&this->old_term_act_,(sigaction *)0x0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigaction: %s",pcVar3);
  }
  iVar1 = sigaction(1,(sigaction *)&this->old_hup_act_,(sigaction *)0x0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigaction: %s",pcVar3);
  }
  iVar1 = sigprocmask(2,(sigset_t *)&this->old_mask_,(sigset_t *)0x0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Fatal("sigprocmask: %s",pcVar3);
  }
  std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::~queue
            (&this->finished_);
  std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::~vector(&this->running_);
  return;
}

Assistant:

SubprocessSet::~SubprocessSet() {
  Clear();

  if (sigaction(SIGINT, &old_int_act_, 0) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigaction(SIGTERM, &old_term_act_, 0) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigaction(SIGHUP, &old_hup_act_, 0) < 0)
    Fatal("sigaction: %s", strerror(errno));
  if (sigprocmask(SIG_SETMASK, &old_mask_, 0) < 0)
    Fatal("sigprocmask: %s", strerror(errno));
}